

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_at_one.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<Argument> *this;
  int iVar1;
  ulong __n;
  reference pvVar2;
  unsigned_long *puVar3;
  Argument *pAVar4;
  ostream *poVar5;
  reference pvVar6;
  size_type local_a8;
  ulong i_1;
  int ret;
  size_type local_88;
  ulong i;
  ulong X;
  undefined1 local_70 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> threads;
  undefined1 local_50 [8];
  vector<Argument,_std::allocator<Argument>_> args;
  runtime_error *err;
  ulong N;
  char **argv_local;
  int argc_local;
  
  __n = parse_arg(argc,argv);
  this = (allocator<Argument> *)
         ((long)&threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<Argument>::allocator(this);
  std::vector<Argument,_std::allocator<Argument>_>::vector
            ((vector<Argument,_std::allocator<Argument>_> *)local_50,__n,this);
  std::allocator<Argument>::~allocator
            ((allocator<Argument> *)
             ((long)&threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&X + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,__n,
             (allocator<unsigned_long> *)((long)&X + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&X + 7));
  i = 0;
  local_88 = __n;
  do {
    local_88 = local_88 - 1;
    if (local_88 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Master thread");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      i = i + 1;
      for (local_a8 = 1; local_a8 < __n; local_a8 = local_a8 + 1) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,
                            local_a8);
        pthread_join(*pvVar6,(void **)0x0);
      }
      argv_local._4_4_ = 0;
      goto LAB_00102875;
    }
    pvVar2 = std::vector<Argument,_std::allocator<Argument>_>::operator[]
                       ((vector<Argument,_std::allocator<Argument>_> *)local_50,local_88);
    pvVar2->x = &i;
    pvVar2->n = local_88;
    puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70);
    pAVar4 = std::vector<Argument,_std::allocator<Argument>_>::data
                       ((vector<Argument,_std::allocator<Argument>_> *)local_50);
    iVar1 = pthread_create(puVar3 + local_88,(pthread_attr_t *)0x0,parallel_inc,pAVar4 + local_88);
  } while (iVar1 == 0);
  poVar5 = std::operator<<((ostream *)&std::cerr,"pthread_create() terminated with code ");
  std::ostream::operator<<(poVar5,iVar1);
  argv_local._4_4_ = -1;
LAB_00102875:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70);
  std::vector<Argument,_std::allocator<Argument>_>::~vector
            ((vector<Argument,_std::allocator<Argument>_> *)local_50);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
  ulong N;
  try{
    N = parse_arg(argc, argv);
  }catch(std::runtime_error &err){
    std::cerr << err.what();
    return -1;
  }
  std::vector<Argument> args(N);
  std::vector<pthread_t> threads(N);
  ulong X = 0;
  for(ulong i = N - 1; i > 0; --i){
    args[i] = {&X, i};
    int ret;
    if((ret = pthread_create(threads.data() + i, nullptr, parallel_inc,
                      reinterpret_cast<void *>(args.data() + i))) != 0){
      std::cerr << "pthread_create() terminated with code " << ret;
      return -1;
    }
  }
  std::cout << "Master thread" << std::endl;
  ++X;
  for(ulong i = 1; i < N; ++i){
    pthread_join(threads[i], nullptr);
  }
  return 0;
}